

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_transform.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListTransformBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  ExpressionClass EVar1;
  pointer this;
  undefined8 uVar2;
  LogicalType *other;
  LogicalType *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  bool has_index;
  BoundLambdaExpression *bound_lambda_expr;
  string *in_stack_ffffffffffffff38;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_ffffffffffffff40;
  BaseExpression *in_stack_ffffffffffffff80;
  LogicalType *in_stack_ffffffffffffff88;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_ffffffffffffff90;
  ClientContext *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ScalarFunction *in_stack_ffffffffffffffb0;
  ClientContext *in_stack_ffffffffffffffb8;
  string local_40 [48];
  LogicalType *local_10;
  
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[](in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
  this = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )in_stack_ffffffffffffff40);
  EVar1 = BaseExpression::GetExpressionClass(&this->super_BaseExpression);
  if (EVar1 != BOUND_LAMBDA) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_40,"Invalid lambda expression!",(allocator *)&stack0xffffffffffffffbf);
    BinderException::BinderException
              ((BinderException *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __cxa_throw(uVar2,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_10,(size_type)in_stack_ffffffffffffff38);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_10,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff38);
  BoundCastExpression::AddArrayCastToList(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  other = (LogicalType *)
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)local_10,(size_type)in_stack_ffffffffffffff38);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_10,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)other);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x201c19a);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x201c1a4);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_10,(size_type)other);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_10);
  BaseExpression::Cast<duckdb::BoundLambdaExpression>(in_stack_ffffffffffffff80);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             local_10);
  LogicalType::LIST(in_stack_ffffffffffffff88);
  LogicalType::operator=(local_10,other);
  LogicalType::~LogicalType((LogicalType *)0x201c20d);
  LambdaFunctions::ListLambdaBind
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (bool)in_stack_ffffffffffffffa7);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListTransformBind(ClientContext &context, ScalarFunction &bound_function,
                                                  vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	bound_function.return_type = LogicalType::LIST(bound_lambda_expr.lambda_expr->return_type);
	auto has_index = bound_lambda_expr.parameter_count == 2;
	return LambdaFunctions::ListLambdaBind(context, bound_function, arguments, has_index);
}